

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint Hash::BOBHash32(uchar *str,uint len,uint num)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar7 = prime[(ulong)num % 0x4cd];
  iVar5 = -len;
  pbVar4 = str + 10;
  uVar2 = 0x9e3779b9;
  uVar1 = 0x9e3779b9;
  for (; 0xb < len; len = len - 0xc) {
    uVar6 = uVar7 + *(int *)(pbVar4 + -2);
    uVar3 = uVar6 >> 0xd ^
            ((uVar2 + *(int *)(pbVar4 + -10)) - (uVar1 + *(int *)(pbVar4 + -6))) - uVar6;
    uVar2 = uVar3 << 8 ^ ((uVar1 + *(int *)(pbVar4 + -6)) - uVar6) - uVar3;
    uVar1 = uVar2 >> 0xd ^ (uVar6 - uVar3) - uVar2;
    uVar6 = uVar1 >> 0xc ^ (uVar3 - uVar2) - uVar1;
    uVar3 = uVar6 << 0x10 ^ (uVar2 - uVar1) - uVar6;
    uVar8 = uVar3 >> 5 ^ (uVar1 - uVar6) - uVar3;
    uVar2 = uVar8 >> 3 ^ (uVar6 - uVar3) - uVar8;
    uVar1 = uVar2 << 10 ^ (uVar3 - uVar8) - uVar2;
    uVar7 = uVar1 >> 0xf ^ (uVar8 - uVar2) - uVar1;
    iVar5 = iVar5 + 0xc;
    pbVar4 = pbVar4 + 0xc;
  }
  uVar3 = uVar7 - iVar5;
  switch(len) {
  case 0xb:
    uVar3 = ((uint)*pbVar4 * 0x1000000 + uVar7) - iVar5;
  case 10:
    uVar3 = uVar3 + (uint)pbVar4[-1] * 0x10000;
  case 9:
    uVar3 = uVar3 + (uint)pbVar4[-2] * 0x100;
  case 8:
    uVar1 = (uint)pbVar4[-3] * 0x1000000 + uVar1;
  case 7:
    uVar1 = (uint)pbVar4[-4] * 0x10000 + uVar1;
  case 6:
    uVar1 = (uint)pbVar4[-5] * 0x100 + uVar1;
  case 5:
    uVar1 = pbVar4[-6] + uVar1;
  case 4:
    uVar2 = (uint)pbVar4[-7] * 0x1000000 + uVar2;
  case 3:
    uVar2 = (uint)pbVar4[-8] * 0x10000 + uVar2;
  case 2:
    uVar2 = (uint)pbVar4[-9] * 0x100 + uVar2;
  case 1:
    uVar2 = pbVar4[-10] + uVar2;
  default:
    uVar6 = uVar3 >> 0xd ^ (uVar2 - uVar1) - uVar3;
    uVar2 = uVar6 << 8 ^ (uVar1 - uVar3) - uVar6;
    uVar1 = uVar2 >> 0xd ^ (uVar3 - uVar6) - uVar2;
    uVar3 = uVar1 >> 0xc ^ (uVar6 - uVar2) - uVar1;
    uVar6 = uVar3 << 0x10 ^ (uVar2 - uVar1) - uVar3;
    uVar2 = uVar6 >> 5 ^ (uVar1 - uVar3) - uVar6;
    uVar3 = uVar2 >> 3 ^ (uVar3 - uVar6) - uVar2;
    uVar1 = uVar3 << 10 ^ (uVar6 - uVar2) - uVar3;
    return uVar1 >> 0xf ^ uVar2 - (uVar3 + uVar1);
  }
}

Assistant:

static uint BOBHash32(const uchar* str, uint len, uint num = 0) {
		// register ub4 a,b,c,len;
		uint a, b, c;
		/* Set up the internal state */
		a = b = 0x9e3779b9;         /* the golden ratio; an arbitrary value */
		c = prime[num % MAX_PRIME]; /* the previous hash value */

		/*---------------------------------------- handle most of the key */
		while (len >= 12) {
			a += (str[0] + ((uint)str[1] << 8) + ((uint)str[2] << 16) +
				((uint)str[3] << 24));
			b += (str[4] + ((uint)str[5] << 8) + ((uint)str[6] << 16) +
				((uint)str[7] << 24));
			c += (str[8] + ((uint)str[9] << 8) + ((uint)str[10] << 16) +
				((uint)str[11] << 24));
			mix(a, b, c);
			str += 12;
			len -= 12;
		}

		/*------------------------------------- handle the last 11 bytes */
		c += len;
		switch (len) /* all the case statements fall through */
		{
		case 11:
			c += ((uint)str[10] << 24);
		case 10:
			c += ((uint)str[9] << 16);
		case 9:
			c += ((uint)str[8] << 8);
			/* the first byte of c is reserved for the length */
		case 8:
			b += ((uint)str[7] << 24);
		case 7:
			b += ((uint)str[6] << 16);
		case 6:
			b += ((uint)str[5] << 8);
		case 5:
			b += str[4];
		case 4:
			a += ((uint)str[3] << 24);
		case 3:
			a += ((uint)str[2] << 16);
		case 2:
			a += ((uint)str[1] << 8);
		case 1:
			a += str[0];
			/* case 0: nothing left to add */
		}
		mix(a, b, c);
		/*-------------------------------------------- report the result */
		return c;
	}